

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O1

void sdf::RenderDepth(Affine3d *transformation,int rows,int cols,Vector4f *cam_params,int max_steps,
                     float max_ray_length,float min_ray_length,float precision,
                     vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives,
                     Mat *Depth)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  Mat Z_img;
  double local_118;
  double dStack_110;
  Vector3d local_a8;
  Mat local_90 [16];
  long local_80;
  long *local_48;
  
  cv::Mat::Mat(local_90,rows,cols,5);
  dVar15 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[4] * 0.0 +
           (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[0] * 0.0;
  dVar24 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[5] * 0.0 +
           (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[1] * 0.0;
  dVar18 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[8];
  dVar21 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[9];
  dVar14 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[10];
  dVar20 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[0xc];
  dVar8 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
          m_storage.m_data.array[0xd];
  dVar3 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
          m_storage.m_data.array[0xe];
  dVar19 = dVar18 * 0.0 + dVar15 + dVar20;
  dVar22 = dVar21 * 0.0 + dVar24 + dVar8;
  dVar17 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[6] * 0.0 +
           (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[2] * 0.0;
  dVar25 = dVar3 + dVar17 + dVar14 * 0.0;
  auVar23._0_8_ = (dVar18 * 1.000000000001 + dVar15 + dVar20) - dVar19;
  auVar23._8_8_ = (dVar21 * 1.000000000001 + dVar24 + dVar8) - dVar22;
  dVar24 = (dVar3 + dVar17 + dVar14 * 1.000000000001) - dVar25;
  dVar15 = dVar24 * dVar24 + auVar23._8_8_ * auVar23._8_8_ + auVar23._0_8_ * auVar23._0_8_;
  if (0.0 < dVar15) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar15;
    auVar9 = sqrtpd(auVar9,auVar9);
    auVar10._0_8_ = auVar9._0_8_;
    dVar24 = dVar24 / auVar10._0_8_;
    auVar10._8_8_ = auVar10._0_8_;
    auVar23 = divpd(auVar23,auVar10);
  }
  if (0 < rows) {
    dVar15 = (double)precision;
    uVar7 = 0;
    do {
      if (0 < cols) {
        uVar6 = 0;
        do {
          uVar1 = *(undefined8 *)
                   ((cam_params->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                    m_storage.m_data.array + 2);
          auVar11._0_8_ = (double)((float)(int)uVar6 - (float)uVar1);
          auVar11._8_8_ = (double)((float)(int)uVar7 - (float)((ulong)uVar1 >> 0x20));
          uVar1 = *(undefined8 *)
                   (cam_params->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                   m_storage.m_data.array;
          dVar18 = (double)(float)((ulong)uVar1 >> 0x20);
          auVar2._8_4_ = SUB84(dVar18,0);
          auVar2._0_8_ = (double)(float)uVar1;
          auVar2._12_4_ = (int)((ulong)dVar18 >> 0x20);
          auVar9 = divpd(auVar11,auVar2);
          dVar18 = auVar9._0_8_;
          dVar21 = auVar9._8_8_;
          auVar16._0_8_ =
               (dVar21 * (transformation->m_matrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                         m_data.array[4] +
                dVar18 * (transformation->m_matrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                         m_data.array[0] +
                (transformation->m_matrix).
                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                [8] + (transformation->m_matrix).
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                      array[0xc]) - dVar19;
          auVar16._8_8_ =
               (dVar21 * (transformation->m_matrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                         m_data.array[5] +
                dVar18 * (transformation->m_matrix).
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                         m_data.array[1] +
                (transformation->m_matrix).
                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                [9] + (transformation->m_matrix).
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                      array[0xd]) - dVar22;
          dVar18 = ((transformation->m_matrix).
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                    array[6] * dVar21 +
                    (transformation->m_matrix).
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                    array[2] * dVar18 +
                    (transformation->m_matrix).
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                    array[10] +
                   (transformation->m_matrix).
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                   array[0xe]) - dVar25;
          auVar12._0_8_ =
               dVar18 * dVar18 + auVar16._8_8_ * auVar16._8_8_ + auVar16._0_8_ * auVar16._0_8_;
          if (0.0 < auVar12._0_8_) {
            auVar12._8_8_ = 0;
            auVar9 = sqrtpd(auVar12,auVar12);
            auVar13._0_8_ = auVar9._0_8_;
            dVar18 = dVar18 / auVar13._0_8_;
            auVar13._8_8_ = auVar13._0_8_;
            auVar16 = divpd(auVar16,auVar13);
          }
          local_118 = auVar23._0_8_;
          dStack_110 = auVar23._8_8_;
          bVar4 = false;
          dVar14 = 0.0;
          iVar5 = 0;
          dVar20 = 1.0;
          dVar21 = (double)min_ray_length;
          do {
            if (((max_steps <= iVar5) || ((double)max_ray_length <= dVar21)) || (bVar4)) break;
            local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = dVar21 * auVar16._0_8_ + dVar19;
            local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = dVar21 * auVar16._8_8_ + dVar22;
            local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = dVar18 * dVar21 + dVar25;
            dVar8 = SDF(&local_a8,primitives);
            if (dVar8 < dVar15) {
              if ((double)min_ray_length <= dVar14) {
                dVar21 = (((dVar21 + dVar15) - dVar14) * dVar20) / (dVar20 - (dVar8 - dVar15)) +
                         dVar14;
                *(float *)(*local_48 * uVar7 + local_80 + uVar6 * 4) =
                     ABS((float)((dVar24 * dVar18 +
                                 dStack_110 * auVar16._8_8_ + local_118 * auVar16._0_8_) * dVar21));
                bVar4 = true;
              }
              else {
                *(undefined4 *)(*local_48 * uVar7 + local_80 + uVar6 * 4) = 0x7fc00000;
              }
            }
            else {
              iVar5 = iVar5 + 1;
              dVar14 = dVar21;
              dVar21 = dVar21 + dVar8;
            }
            dVar20 = dVar8;
          } while (dVar15 <= dVar8);
          if (!bVar4) {
            *(undefined4 *)(*local_48 * uVar7 + local_80 + uVar6 * 4) = 0x7fc00000;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != (uint)cols);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)rows);
  }
  cv::Mat::operator=(Depth,local_90);
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void RenderDepth(
    const Eigen::Affine3d &transformation, 
    const int rows, 
    const int cols, 
    Eigen::Vector4f &cam_params, 
    const int max_steps, 
    const float max_ray_length,
    const float min_ray_length,
    const float precision, 
    std::vector<Primitive*> &primitives, 
    cv::Mat &Depth)
  {

  // add noise to depth
  // std::mt19937_64 generator;
  // std::normal_distribution<float> distribution(0,RENDER_NOISE_STD);

  cv::Mat Z_img( rows, cols, CV_32FC1);

   Eigen::Vector3d camera = transformation * Eigen::Vector3d(0.0,0.0,0.0);
   Eigen::Vector3d viewAxis = (transformation * Eigen::Vector3d(0.0,0.0,1.0+1e-12) - camera).normalized();

  //Rendering loop
  #pragma omp parallel for collapse(2)
  for(int u = 0; u < rows; ++u)
  {
    for(int v = 0; v < cols; ++v)
    {
      bool hit = false;
      Eigen::Vector3d p = transformation*makeRay(u, v, 1.0, cam_params(0), cam_params(1), cam_params(2), cam_params(3)) - camera;


      p.normalize();
            
      double scaling = min_ray_length;
      double scaling_prev=0;
      double D = 1.0;
      int steps=0;
      while(steps<max_steps && scaling < max_ray_length && !hit)
      { 

        double D_prev = D;
        D = sdf::SDF(camera + p*scaling, primitives);
        if(D < precision)
        {
          if(scaling_prev < min_ray_length)
          {
              Z_img.at<float>(u,v)=std::numeric_limits<float>::quiet_NaN();    
              break;
          }
          scaling = scaling_prev + ((scaling+precision) - scaling_prev)*D_prev/(D_prev - (D - precision));

          hit = true;
          float d = scaling*(viewAxis.dot(p));
          
          //conversion from range to depth
          // + scaling*scaling*distribution(generator)); //add noise dependent on the square of the distance
          Z_img.at<float>(u,v)=fabs(d);

          break;
        }
        scaling_prev = scaling;
        scaling += D;  
        ++steps;        
      }//ray
      if(!hit)     
      {
        Z_img.at<float>(u,v)=std::numeric_limits<float>::quiet_NaN();    
      }//no hit
    }//NUM_COLS
  }//NUM_ROWS
  Depth = Z_img;
  return;
  }